

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiWindow_*> *windows;
  ImVector<ImGuiPopupData> *this;
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiContext *g;
  ImGuiIO *pIVar8;
  ImDrawList **ppIVar9;
  ImGuiPopupData *pIVar10;
  ImGuiTabBar *tab_bar;
  ImGuiTabItem *tab;
  ImGuiWindow **ppIVar11;
  char *pcVar12;
  char *label;
  char *pcVar13;
  int i;
  int iVar14;
  uint i_00;
  long lVar15;
  int i_1;
  char *pcVar16;
  int n;
  undefined8 uVar17;
  ImDrawList *this_00;
  ImRect IVar18;
  ImVec2 local_180;
  char *wrt_rects_names [7];
  ImRect r;
  
  bVar7 = Begin("Dear ImGui Metrics",p_open,0);
  pIVar5 = GImGui;
  if (bVar7) {
    wrt_rects_names[6] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    pIVar8 = GetIO();
    iVar14 = 0;
    Text("Dear ImGui %s","1.75");
    Text("Application average %.3f ms/frame (%.1f FPS)",
         SUB84((double)(1000.0 / pIVar8->Framerate),0),(double)pIVar8->Framerate);
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)pIVar8->MetricsRenderVertices,
         (ulong)(uint)pIVar8->MetricsRenderIndices,
         (long)pIVar8->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)pIVar8->MetricsActiveWindows,
         (ulong)(uint)pIVar8->MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)pIVar8->MetricsActiveAllocations);
    Separator();
    windows = &pIVar5->Windows;
    ShowMetricsWindow::Funcs::NodeWindows(windows,"Windows");
    bVar7 = TreeNode("DrawLists","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar5->DrawDataBuilder).Layers[0].Size);
    if (bVar7) {
      for (; iVar14 < (pIVar5->DrawDataBuilder).Layers[0].Size; iVar14 = iVar14 + 1) {
        ppIVar9 = ImVector<ImDrawList_*>::operator[]((pIVar5->DrawDataBuilder).Layers,iVar14);
        ShowMetricsWindow::Funcs::NodeDrawList((ImGuiWindow *)0x0,*ppIVar9,label);
      }
      TreePop();
    }
    bVar7 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar5->OpenPopupStack).Size);
    if (bVar7) {
      this = &pIVar5->OpenPopupStack;
      for (iVar14 = 0; iVar14 < this->Size; iVar14 = iVar14 + 1) {
        pIVar10 = ImVector<ImGuiPopupData>::operator[](this,iVar14);
        pIVar3 = pIVar10->Window;
        pIVar10 = ImVector<ImGuiPopupData>::operator[](this,iVar14);
        pcVar12 = "";
        pcVar13 = "NULL";
        pcVar16 = "";
        if (pIVar3 != (ImGuiWindow *)0x0) {
          pcVar13 = pIVar3->Name;
          pcVar12 = " ChildWindow";
          if (((uint)pIVar3->Flags >> 0x18 & 1) == 0) {
            pcVar12 = "";
          }
          pcVar16 = " ChildMenu";
          if (((uint)pIVar3->Flags >> 0x1c & 1) == 0) {
            pcVar16 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar10->PopupId,pcVar13,pcVar12,
                   pcVar16);
      }
      TreePop();
    }
    bVar7 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar5->TabBars).Buf.Size);
    if (bVar7) {
      for (iVar14 = 0; iVar14 < (pIVar5->TabBars).Buf.Size; iVar14 = iVar14 + 1) {
        tab_bar = ImVector<ImGuiTabBar>::operator[](&(pIVar5->TabBars).Buf,iVar14);
        pcVar13 = "";
        if (tab_bar->PrevFrameVisible < GImGui->FrameCount + -2) {
          pcVar13 = " *Inactive*";
        }
        ImFormatString((char *)&r,0x100,"TabBar (%d tabs)%s",(ulong)(uint)(tab_bar->Tabs).Size,
                       pcVar13);
        bVar7 = TreeNode(tab_bar,"%s",&r);
        if (bVar7) {
          for (i_00 = 0; (int)i_00 < (tab_bar->Tabs).Size; i_00 = i_00 + 1) {
            tab = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,i_00);
            PushID(tab);
            bVar7 = SmallButton("<");
            if (bVar7) {
              TabBarQueueChangeTabOrder(tab_bar,tab,-1);
            }
            SameLine(0.0,2.0);
            bVar7 = SmallButton(">");
            if (bVar7) {
              TabBarQueueChangeTabOrder(tab_bar,tab,1);
            }
            SameLine(0.0,-1.0);
            uVar2 = tab->ID;
            uVar17 = 0x2a;
            if (uVar2 != tab_bar->SelectedTabId) {
              uVar17 = 0x20;
            }
            pcVar13 = "";
            if (tab->NameOffset != -1) {
              pcVar13 = ImGuiTabBar::GetTabName(tab_bar,tab);
            }
            Text("%02d%c Tab 0x%08X \'%s\'",(ulong)i_00,uVar17,(ulong)uVar2,pcVar13);
            PopID();
          }
          TreePop();
        }
      }
      TreePop();
    }
    bVar7 = TreeNode("Internal state");
    if (bVar7) {
      pcVar12 = "NULL";
      pcVar13 = "NULL";
      if (pIVar5->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar13 = pIVar5->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar13);
      pcVar13 = "NULL";
      if (pIVar5->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar13 = pIVar5->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar13);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
           SUB84((double)pIVar5->HoveredIdTimer,0),(ulong)pIVar5->HoveredId,
           (ulong)pIVar5->HoveredIdPreviousFrame,(ulong)pIVar5->HoveredIdAllowOverlap);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar5->ActiveIdTimer,0),(ulong)pIVar5->ActiveId,
           (ulong)pIVar5->ActiveIdPreviousFrame,(ulong)pIVar5->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_001eac60 + (ulong)pIVar5->ActiveIdSource * 8));
      pcVar13 = "NULL";
      if (pIVar5->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar13 = pIVar5->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar13);
      pcVar13 = "NULL";
      if (pIVar5->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar13 = pIVar5->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar13);
      pcVar13 = "NULL";
      if (pIVar5->NavWindow != (ImGuiWindow *)0x0) {
        pcVar13 = pIVar5->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar13);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar5->NavId,(ulong)pIVar5->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001eac60 + (ulong)pIVar5->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar5->IO).NavActive,
           (ulong)(pIVar5->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar5->NavActivateId,
           (ulong)pIVar5->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar5->NavDisableHighlight,
           (ulong)pIVar5->NavDisableMouseHover);
      if (pIVar5->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar12 = pIVar5->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar12);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar5->DragDropActive,(ulong)(pIVar5->DragDropPayload).SourceId,
           (pIVar5->DragDropPayload).DataType,(ulong)(uint)(pIVar5->DragDropPayload).DataSize);
      TreePop();
    }
    bVar7 = TreeNode("Tools");
    if (bVar7) {
      auVar4._8_8_ = 0;
      auVar4._0_4_ = r.Max.x;
      auVar4._4_4_ = r.Max.y;
      r = (ImRect)(auVar4 << 0x40);
      bVar7 = Button("Item Picker..",&r.Min);
      if (bVar7) {
        GImGui->DebugItemPickerActive = true;
      }
      SameLine(0.0,-1.0);
      TextDisabled("(?)");
      bVar7 = IsItemHovered(0);
      if (bVar7) {
        BeginTooltip();
        PushTextWrapPos(0.0);
        TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                        ,(char *)0x0);
        PopTextWrapPos();
        EndTooltip();
      }
      Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
      Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
      SameLine(0.0,-1.0);
      pIVar6 = GImGui;
      fVar1 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar6->NextItemData).Width = fVar1 * 12.0;
      bVar7 = Combo("##show_windows_rect_type",&ShowMetricsWindow::show_windows_rect_type,
                    wrt_rects_names,7,7);
      ShowMetricsWindow::show_windows_rects = (bool)(ShowMetricsWindow::show_windows_rects | bVar7);
      if ((ShowMetricsWindow::show_windows_rects != false) &&
         (pIVar5->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",pIVar5->NavWindow->Name);
        Indent(0.0);
        for (lVar15 = 0; lVar15 != 7; lVar15 = lVar15 + 1) {
          IVar18 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar5->NavWindow,(int)lVar15);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar18.Min.x,0),
               (double)IVar18.Min.y,(double)IVar18.Max.x,(double)IVar18.Max.y,
               (double)(IVar18.Max.x - IVar18.Min.x),(double)(IVar18.Max.y - IVar18.Min.y),
               wrt_rects_names[lVar15]);
        }
        Unindent(0.0);
      }
      Checkbox("Show details when hovering ImDrawCmd node",&ShowMetricsWindow::show_drawcmd_details)
      ;
      TreePop();
    }
    if ((ShowMetricsWindow::show_windows_rects != false) ||
       (ShowMetricsWindow::show_windows_begin_order == true)) {
      for (iVar14 = 0; iVar14 < windows->Size; iVar14 = iVar14 + 1) {
        ppIVar11 = ImVector<ImGuiWindow_*>::operator[](windows,iVar14);
        pIVar3 = *ppIVar11;
        if (pIVar3->WasActive == true) {
          this_00 = &GImGui->ForegroundDrawList;
          if (ShowMetricsWindow::show_windows_rects == true) {
            r = ShowMetricsWindow::Funcs::GetWindowRect
                          (pIVar3,ShowMetricsWindow::show_windows_rect_type);
            ImDrawList::AddRect(this_00,&r.Min,&r.Max,0xff8000ff,0.0,0xf,1.0);
          }
          if ((ShowMetricsWindow::show_windows_begin_order == true) &&
             ((pIVar3->Flags & 0x1000000) == 0)) {
            ImFormatString((char *)&r,0x20,"%d",(ulong)(uint)(int)pIVar3->BeginOrderWithinContext);
            local_180.y = GImGui->FontSize + (pIVar3->Pos).y;
            local_180.x = GImGui->FontSize + (pIVar3->Pos).x;
            ImDrawList::AddRectFilled(this_00,&pIVar3->Pos,&local_180,0xff6464c8,0.0,0xf);
            ImDrawList::AddText(this_00,&pIVar3->Pos,0xffffffff,(char *)&r,(char *)0x0);
          }
        }
      }
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("Dear ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersDesired, TRT_ColumnsContentRowsFrozen, TRT_ColumnsContentRowsUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersDesired", "ColumnsContentRowsFrozen", "ColumnsContentRowsUnfrozen" };

    // State
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = WRT_WorkRect;
    static bool show_windows_begin_order = false;
    static bool show_tables_rects = false;
    static int  show_tables_rect_type = TRT_WorkRect;
    static bool show_drawcmd_details = true;

    // Basic info
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    // Helper functions to display common structures:
    // - NodeDrawList()
    // - NodeColumns()
    // - NodeWindow()
    // - NodeWindows()
    // - NodeTabBar()
    // - NodeStorage()
    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }

        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_details && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
                    for (unsigned int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255,0,255,255));
                    fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (fg_draw_list && ImGui::IsItemHovered() && show_drawcmd_details)
                {
                    // Draw wire-frame version of everything
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    ImRect clip_rect = pcmd->ClipRect;
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255));
                    for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                    {
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++)
                            triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                        fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    }
                    fg_draw_list->Flags = backup_flags;
                }

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            bool open = ImGui::TreeNode(label, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window);
            if (ImGui::IsItemHovered() && window->WasActive)
                ImGui::GetForegroundDrawList()->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            p += ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s", tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X '%s'", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "");
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }

        static void NodeStorage(ImGuiStorage* storage, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
                return;
            for (int n = 0; n < storage->Data.Size; n++)
            {
                const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
                ImGui::BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
            }
            ImGui::TreePop();
        }
    };

    Funcs::NodeWindows(g.Windows, "Windows");
    //Funcs::NodeWindows(g.WindowsFocusOrder, "WindowsFocusOrder");
    if (ImGui::TreeNode("DrawLists", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }

    // Details for Popups
    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    // Details for TabBars
    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

    // Details for Tables
    IM_UNUSED(trt_rects_names);
    IM_UNUSED(show_tables_rects);
    IM_UNUSED(show_tables_rect_type);
#ifdef IMGUI_HAS_TABLE
    if (ImGui::TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            Funcs::NodeTable(g.Tables.GetByIndex(n));
        ImGui::TreePop();
    }
#endif // #define IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (ImGui::TreeNode("Docking"))
    {
        ImGui::TreePop();
    }
#endif // #define IMGUI_HAS_DOCK

    // Misc Details
    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }

    // Tools
    if (ImGui::TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (ImGui::Button("Item Picker.."))
            ImGui::DebugStartItemPicker();
        ImGui::SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##show_windows_rect_type", &show_windows_rect_type, wrt_rects_names, WRT_Count, WRT_Count);
        if (show_windows_rects && g.NavWindow)
        {
            ImGui::BulletText("'%s':", g.NavWindow->Name);
            ImGui::Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                ImGui::Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            ImGui::Unindent();
        }
        ImGui::Checkbox("Show details when hovering ImDrawCmd node", &show_drawcmd_details);
        ImGui::TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r = Funcs::GetWindowRect(window, show_windows_rect_type);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (show_tables_rects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
        }
    }
#endif // #define IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #define IMGUI_HAS_DOCK

    ImGui::End();
}